

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning_wap(ldf *data,single_learner *base,size_t start_K,multi_ex *ec_seq)

{
  uint64_t uVar1;
  double dVar2;
  reference ppeVar3;
  wclass *pwVar4;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  ulong in_RDX;
  example *in_RDI;
  uint64_t old_offset;
  float old_weight;
  float value_diff;
  v_array<COST_SENSITIVE::wclass> costs2;
  example *ec2;
  size_t k2;
  v_array<COST_SENSITIVE::wclass> costs1;
  label_data *simple_label;
  label save_cs_label;
  example *ec1;
  size_t k1;
  size_t k;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> all_costs;
  size_t K;
  value_type *in_stack_fffffffffffffe38;
  example *in_stack_fffffffffffffe40;
  value_type in_stack_fffffffffffffe48;
  vw *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  float fVar5;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
  *in_stack_fffffffffffffe88;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
  *in_stack_fffffffffffffe90;
  v_array<COST_SENSITIVE::wclass> local_108;
  value_type local_e8;
  ulong local_e0;
  v_array<COST_SENSITIVE::wclass> local_d8;
  polylabel *local_b0;
  label_t local_a8;
  wclass *pwStack_a0;
  wclass *local_98;
  size_t sStack_90;
  value_type local_88;
  ulong local_80;
  wclass *local_50;
  ulong local_48;
  size_type local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  ulong local_18;
  example *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_28 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RCX);
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)0x382fc9
            );
  for (local_48 = local_18; local_48 < local_28; local_48 = local_48 + 1) {
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_48);
    local_50 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar3)->l).simple,0);
    std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::push_back
              ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  compute_wap_values((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::~vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             in_stack_fffffffffffffe50);
  for (local_80 = local_18; local_80 < local_28; local_80 = local_80 + 1) {
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_80);
    local_88 = *ppeVar3;
    local_d8._begin = *(wclass **)&(local_88->l).multi;
    local_d8._end = (local_88->l).cs.costs._end;
    local_d8.end_array = (local_88->l).cs.costs.end_array;
    local_d8.erase_count = (local_88->l).cs.costs.erase_count;
    local_b0 = &local_88->l;
    local_a8 = (label_t)local_d8._begin;
    pwStack_a0 = local_d8._end;
    local_98 = local_d8.end_array;
    sStack_90 = local_d8.erase_count;
    pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](&local_d8,0);
    if (pwVar4->class_index != 0xffffffff) {
      v_array<COST_SENSITIVE::wclass>::operator[](&local_d8,0);
      LabelDict::add_example_namespace_from_memory
                ((label_feature_map *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (size_t)in_stack_fffffffffffffe40);
      local_e0 = local_80;
      while (local_e0 = local_e0 + 1, local_e0 < local_28) {
        ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_e0);
        local_e8 = *ppeVar3;
        local_108._begin = *(wclass **)&(local_e8->l).multi;
        local_108._end = (local_e8->l).cs.costs._end;
        local_108.end_array = (local_e8->l).cs.costs.end_array;
        local_108.erase_count = (local_e8->l).cs.costs.erase_count;
        pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](&local_108,0);
        if (pwVar4->class_index != 0xffffffff) {
          pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](&local_108,0);
          fVar5 = pwVar4->wap_value;
          pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](&local_d8,0);
          dVar2 = std::fabs((double)(ulong)(uint)(fVar5 - pwVar4->wap_value));
          if (1e-06 <= SUB84(dVar2,0)) {
            v_array<COST_SENSITIVE::wclass>::operator[](&local_108,0);
            LabelDict::add_example_namespace_from_memory
                      ((label_feature_map *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (size_t)in_stack_fffffffffffffe40);
            (local_b0->simple).initial = 0.0;
            pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](&local_d8,0);
            fVar5 = pwVar4->x;
            pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](&local_108,0);
            (local_b0->simple).label = *(float *)(&DAT_003e9780 + (ulong)(fVar5 < pwVar4->x) * 4);
            fVar5 = local_88->weight;
            local_88->weight = SUB84(dVar2,0);
            local_88->partial_prediction = 0.0;
            subtract_example(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                             in_stack_fffffffffffffe40);
            uVar1 = (local_88->super_example_predict).ft_offset;
            (local_88->super_example_predict).ft_offset =
                 (uint64_t)(local_8->super_example_predict).feature_space[2].values._begin;
            LEARNER::learner<char,_example>::learn
                      ((learner<char,_example> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                       ,(size_t)in_stack_fffffffffffffe40);
            (local_88->super_example_predict).ft_offset = uVar1;
            local_88->weight = fVar5;
            unsubtract_example(in_stack_fffffffffffffe40);
            v_array<COST_SENSITIVE::wclass>::operator[](&local_108,0);
            LabelDict::del_example_namespace_from_memory
                      ((label_feature_map *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (size_t)in_stack_fffffffffffffe40);
          }
        }
      }
      in_stack_fffffffffffffe40 = local_8;
      in_stack_fffffffffffffe48 = local_88;
      in_stack_fffffffffffffe50 = (vw *)v_array<COST_SENSITIVE::wclass>::operator[](&local_d8,0);
      LabelDict::del_example_namespace_from_memory
                ((label_feature_map *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (size_t)in_stack_fffffffffffffe40);
      (local_88->l).multi = local_a8;
      (local_88->l).cs.costs._end = pwStack_a0;
      (local_88->l).cs.costs.end_array = local_98;
      (local_88->l).cs.costs.erase_count = sStack_90;
    }
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::~vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             in_stack_fffffffffffffe50);
  return;
}

Assistant:

void do_actual_learning_wap(ldf& data, single_learner& base, size_t start_K, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  vector<COST_SENSITIVE::wclass*> all_costs;
  for (size_t k = start_K; k < K; k++) all_costs.push_back(&ec_seq[k]->l.cs.costs[0]);
  compute_wap_values(all_costs);

  for (size_t k1 = start_K; k1 < K; k1++)
  {
    example* ec1 = ec_seq[k1];

    // save original variables
    COST_SENSITIVE::label save_cs_label = ec1->l.cs;
    label_data& simple_label = ec1->l.simple;

    v_array<COST_SENSITIVE::wclass> costs1 = save_cs_label.costs;
    if (costs1[0].class_index == (uint32_t)-1)
      continue;

    LabelDict::add_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    for (size_t k2 = k1 + 1; k2 < K; k2++)
    {
      example* ec2 = ec_seq[k2];
      v_array<COST_SENSITIVE::wclass> costs2 = ec2->l.cs.costs;

      if (costs2[0].class_index == (uint32_t)-1)
        continue;
      float value_diff = fabs(costs2[0].wap_value - costs1[0].wap_value);
      // float value_diff = fabs(costs2[0].x - costs1[0].x);
      if (value_diff < 1e-6)
        continue;

      LabelDict::add_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);

      // learn
      simple_label.initial = 0.;
      simple_label.label = (costs1[0].x < costs2[0].x) ? -1.0f : 1.0f;
      float old_weight = ec1->weight;
      ec1->weight = value_diff;
      ec1->partial_prediction = 0.;
      subtract_example(*data.all, ec1, ec2);
      uint64_t old_offset = ec1->ft_offset;
      ec1->ft_offset = data.ft_offset;
      base.learn(*ec1);
      ec1->ft_offset = old_offset;
      ec1->weight = old_weight;
      unsubtract_example(ec1);

      LabelDict::del_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);
    }
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    // restore original cost-sensitive label, sum of importance weights
    ec1->l.cs = save_cs_label;
    // TODO: What about partial_prediction? See do_actual_learning_oaa.
  }
}